

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::setEigenDecomposition
          (EigenDecompositionSquare<double,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  size_t __n;
  
  memcpy((this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex],inEigenValues,
         (ulong)(uint)this->kEigenValuesSize << 3);
  iVar2 = (this->super_EigenDecomposition<double,_1>).kStateCount;
  __n = (ulong)(uint)(iVar2 * iVar2) << 3;
  memcpy(this->gEMatrices[eigenIndex],inEigenVectors,__n);
  memcpy(this->gIMatrices[eigenIndex],inInverseEigenVectors,__n);
  if (((this->super_EigenDecomposition<double,_1>).kFlags & 0x200000) != 0) {
    iVar2 = (this->super_EigenDecomposition<double,_1>).kStateCount;
    lVar3 = (long)iVar2;
    if (1 < lVar3) {
      uVar7 = 0;
      pdVar5 = this->gIMatrices[eigenIndex];
      pdVar6 = pdVar5 + lVar3;
      lVar4 = lVar3;
      do {
        lVar8 = 1;
        pdVar9 = pdVar6;
        do {
          dVar1 = pdVar5[lVar8];
          pdVar5[lVar8] = *pdVar9;
          *pdVar9 = dVar1;
          lVar8 = lVar8 + 1;
          pdVar9 = pdVar9 + lVar3;
        } while (lVar4 != lVar8);
        uVar7 = uVar7 + 1;
        lVar4 = lVar4 + -1;
        pdVar6 = pdVar6 + lVar3 + 1;
        pdVar5 = pdVar5 + lVar3 + 1;
      } while (uVar7 != iVar2 - 1);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										             const double* inEigenVectors,
                                                     const double* inInverseEigenVectors,
                                                     const double* inEigenValues) {
    
	beagleMemCpy(gEigenValues[eigenIndex],inEigenValues,kEigenValuesSize);
	const int len = kStateCount * kStateCount;
	beagleMemCpy(gEMatrices[eigenIndex],inEigenVectors,len);
	beagleMemCpy(gIMatrices[eigenIndex],inInverseEigenVectors,len);
    if (kFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED) // TODO: optimize, might not need to transpose here
        transposeSquareMatrix(gIMatrices[eigenIndex], kStateCount);
}